

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

int file_write(BIO *b,char *in,int inl)

{
  size_t sVar1;
  int local_28;
  int ret;
  int inl_local;
  char *in_local;
  BIO *b_local;
  
  if (b->init == 0) {
    b_local._4_4_ = 0;
  }
  else {
    sVar1 = fwrite(in,(long)inl,1,(FILE *)b->ptr);
    local_28 = (int)sVar1;
    if (0 < local_28) {
      local_28 = inl;
    }
    b_local._4_4_ = local_28;
  }
  return b_local._4_4_;
}

Assistant:

static int file_write(BIO *b, const char *in, int inl) {
  if (!b->init) {
    return 0;
  }

  int ret = (int)fwrite(in, inl, 1, (FILE *)b->ptr);
  if (ret > 0) {
    ret = inl;
  }
  return ret;
}